

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

uint32_t helper_neon_qrdmlah_s32_arm(CPUARMState *env,int32_t src1,int32_t src2,int32_t src3)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = (long)src3 * 0x80000000 + (long)src2 * (long)src1 + 0x40000000;
  uVar2 = lVar1 >> 0x1f;
  if ((long)(int)uVar2 != uVar2) {
    (env->vfp).qc[0] = 1;
    uVar2 = lVar1 >> 0x3f ^ 0x7fffffff;
  }
  return (uint32_t)uVar2;
}

Assistant:

uint32_t HELPER(neon_qrdmlah_s32)(CPUARMState *env, int32_t src1,
                                  int32_t src2, int32_t src3)
{
    /* Simplify similarly to int_qrdmlah_s16 above.  */
    int64_t ret = (int64_t)src1 * src2;
    ret = ((int64_t)src3 << 31) + ret + (1 << 30);
    ret >>= 31;
    if (ret != (int32_t)ret) {
        SET_QC();
        ret = (ret < 0 ? INT32_MIN : INT32_MAX);
    }
    return ret;
}